

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::UpdateImageObject
               (Image *image,string *baseDir,int index,bool embedImages,
               WriteImageDataFunction *WriteImageData,void *user_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  _Alloc_hider _Var10;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string uri;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ext;
  string filename;
  string local_e8;
  undefined4 local_c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string local_80;
  string *local_60;
  void *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000009,embedImages);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_98 = 0;
  local_90[0] = 0;
  local_a0 = local_90;
  local_60 = baseDir;
  local_58 = user_data;
  if ((image->uri)._M_string_length == 0) {
    if ((image->name)._M_string_length != 0) {
      MimeToExt(&local_e8,&image->mimeType);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e8);
      paVar1 = &local_e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      paVar11 = &local_b0;
      pcVar2 = (image->name)._M_dataplus._M_p;
      local_c0 = paVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar2,pcVar2 + (image->name)._M_string_length);
      std::__cxx11::string::append((char *)&local_c0);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_e8.field_2._M_allocated_capacity = *puVar7;
        local_e8.field_2._8_8_ = plVar4[3];
        local_e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *puVar7;
        local_e8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_e8);
      _Var10._M_p = (pointer)local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
        _Var10._M_p = (pointer)local_c0;
      }
      goto LAB_00281b2f;
    }
    MimeToExt(&local_e8,&image->mimeType);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    __val = -index;
    if (0 < index) {
      __val = index;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00281bc2;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00281bc2;
        }
        if (uVar6 < 10000) goto LAB_00281bc2;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00281bc2:
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(index >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50[0]->_M_local_buf + ((uint)index >> 0x1f),__len,__val);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0._M_allocated_capacity = *psVar8;
      local_b0._8_8_ = puVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0._M_allocated_capacity = *psVar8;
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar5;
    }
    local_b8 = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_e8.field_2._M_allocated_capacity = *puVar7;
      local_e8.field_2._8_8_ = puVar5[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *puVar7;
      local_e8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_e8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    _Var10._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) goto LAB_00281b39;
  }
  else {
    std::__cxx11::string::find_last_of((char *)&image->uri,0x2e23b7,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)&image->uri);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_e8);
    paVar11 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar11) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    GetFilePathExtension(&local_e8,&local_80);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e8);
    _Var10._M_p = local_e8._M_dataplus._M_p;
LAB_00281b2f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == paVar11) goto LAB_00281b39;
  }
  operator_delete(_Var10._M_p);
LAB_00281b39:
  if (*WriteImageData != (WriteImageDataFunction)0x0) {
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    (**WriteImageData)(local_60,&local_80,image,local_c4._0_1_,local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void UpdateImageObject(Image &image, std::string &baseDir, int index,
                              bool embedImages,
                              WriteImageDataFunction *WriteImageData = nullptr,
                              void *user_data = nullptr) {
  std::string filename;
  std::string ext;

  // If image have uri. Use it it as a filename
  if (image.uri.size()) {
    filename = GetBaseFilename(image.uri);
    ext = GetFilePathExtension(filename);

  } else if (image.name.size()) {
    ext = MimeToExt(image.mimeType);
    // Otherwise use name as filename
    filename = image.name + "." + ext;
  } else {
    ext = MimeToExt(image.mimeType);
    // Fallback to index of image as filename
    filename = std::to_string(index) + "." + ext;
  }

  // If callback is set, modify image data object
  if (*WriteImageData != nullptr) {
    std::string uri;
    (*WriteImageData)(&baseDir, &filename, &image, embedImages, user_data);
  }
}